

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcCraneRailAShapeProfileDef::~IfcCraneRailAShapeProfileDef
          (IfcCraneRailAShapeProfileDef *this)

{
  *(undefined8 *)&this[-1].Radius.have = 0x8583f8;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x80 = 0x858420;
  if ((Out *)this[-1].BaseDepth1 != &this[-1].BaseDepth3) {
    operator_delete((undefined1 *)this[-1].BaseDepth1,(long)this[-1].BaseDepth3 + 1);
  }
  if ((Out *)this[-1].HeadDepth2 != &this[-1].WebThickness) {
    operator_delete((undefined1 *)this[-1].HeadDepth2,(long)this[-1].WebThickness + 1);
  }
  operator_delete(&this[-1].Radius.have,0x108);
  return;
}

Assistant:

IfcCraneRailAShapeProfileDef() : Object("IfcCraneRailAShapeProfileDef") {}